

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O2

uchar * __thiscall phosg::MD5::MD5(MD5 *this,uchar *d,size_t n,uchar *md)

{
  size_t sVar1;
  uchar *extraout_RAX;
  long lVar2;
  size_t z;
  ulong uVar3;
  StringWriter w;
  anon_class_8_1_8991fb9c process_block;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  anon_class_8_1_8991fb9c local_28;
  
  this->a0 = 0x67452301;
  this->b0 = 0xefcdab89;
  this->c0 = 0x98badcfe;
  this->d0 = 0x10325476;
  local_28.this = this;
  for (lVar2 = 0; lVar2 + 0x3fU < n; lVar2 = lVar2 + 0x40) {
    MD5::anon_class_8_1_8991fb9c::operator()(&local_28,d + lVar2);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  StringWriter::write((StringWriter *)&local_48,(int)d + (int)lVar2,(void *)(n - lVar2),(size_t)md);
  StringWriter::put_u8((StringWriter *)&local_48,0x80);
  sVar1 = StringWriter::size((StringWriter *)&local_48);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&local_48,(ulong)(0x38 < sVar1) * 0x40 + 0x40,'\0');
  sVar1 = StringWriter::size((StringWriter *)&local_48);
  StringWriter::pput_u64l((StringWriter *)&local_48,sVar1 - 8,n << 3);
  uVar3 = 0;
  while( true ) {
    sVar1 = StringWriter::size((StringWriter *)&local_48);
    if (sVar1 <= uVar3) break;
    MD5::anon_class_8_1_8991fb9c::operator()(&local_28,local_48._M_dataplus._M_p + uVar3);
    uVar3 = uVar3 + 0x40;
  }
  ::std::__cxx11::string::~string((string *)&local_48);
  return extraout_RAX;
}

Assistant:

MD5::MD5(const void* data, size_t size) {
  this->a0 = 0x67452301;
  this->b0 = 0xEFCDAB89;
  this->c0 = 0x98BADCFE;
  this->d0 = 0x10325476;

  auto process_block = [this](const void* block) -> void {
    // clang-format off
    static const uint32_t shifts[64] = {
        7, 12, 17, 22,  7, 12, 17, 22,  7, 12, 17, 22,  7, 12, 17, 22,
        5,  9, 14, 20,  5,  9, 14, 20,  5,  9, 14, 20,  5,  9, 14, 20,
        4, 11, 16, 23,  4, 11, 16, 23,  4, 11, 16, 23,  4, 11, 16, 23,
        6, 10, 15, 21,  6, 10, 15, 21,  6, 10, 15, 21,  6, 10, 15, 21};
    static const uint32_t sine_table[64] = {
        0xD76AA478, 0xE8C7B756, 0x242070DB, 0xC1BDCEEE,
        0xF57C0FAF, 0x4787C62A, 0xA8304613, 0xFD469501,
        0x698098D8, 0x8B44F7AF, 0xFFFF5BB1, 0x895CD7BE,
        0x6B901122, 0xFD987193, 0xA679438E, 0x49B40821,
        0xF61E2562, 0xC040B340, 0x265E5A51, 0xE9B6C7AA,
        0xD62F105D, 0x02441453, 0xD8A1E681, 0xE7D3FBC8,
        0x21E1CDE6, 0xC33707D6, 0xF4D50D87, 0x455A14ED,
        0xA9E3E905, 0xFCEFA3F8, 0x676F02D9, 0x8D2A4C8A,
        0xFFFA3942, 0x8771F681, 0x6D9D6122, 0xFDE5380C,
        0xA4BEEA44, 0x4BDECFA9, 0xF6BB4B60, 0xBEBFBC70,
        0x289B7EC6, 0xEAA127FA, 0xD4EF3085, 0x04881D05,
        0xD9D4D039, 0xE6DB99E5, 0x1FA27CF8, 0xC4AC5665,
        0xF4292244, 0x432AFF97, 0xAB9423A7, 0xFC93A039,
        0x655B59C3, 0x8F0CCC92, 0xFFEFF47D, 0x85845DD1,
        0x6FA87E4F, 0xFE2CE6E0, 0xA3014314, 0x4E0811A1,
        0xF7537E82, 0xBD3AF235, 0x2AD7D2BB, 0xEB86D391};
    // clang-format on
    const le_uint32_t* fields = reinterpret_cast<const le_uint32_t*>(block);

    uint32_t a = this->a0, b = this->b0, c = this->c0, d = this->d0;
    for (size_t x = 0; x < 64; x++) {
      uint32_t f, g;
      if (x < 16) {
        f = (b & c) | ((~b) & d);
        g = x;
      } else if (x < 32) {
        f = (b & d) | (c & (~d));
        g = ((5 * x) + 1) & 15;
      } else if (x < 48) {
        f = b ^ c ^ d;
        g = ((3 * x) + 5) & 15;
      } else {
        f = c ^ (b | (~d));
        g = (7 * x) & 15;
      }
      uint32_t dt = d;
      uint32_t b_addend = a + f + sine_table[x] + fields[g];
      d = c;
      c = b;
      b = b + ((b_addend << shifts[x]) | (b_addend >> (32 - shifts[x])));
      a = dt;
    }
    this->a0 += a;
    this->b0 += b;
    this->c0 += c;
    this->d0 += d;
  };

  // Process all possible blocks from the input until just before the end
  size_t processed_offset;
  for (processed_offset = 0; processed_offset + 0x3F < size; processed_offset += 0x40) {
    process_block(reinterpret_cast<const uint8_t*>(data) + processed_offset);
  }

  // Make a copy of the last (possibly incomplete) block, append the trailer,
  // and process what remains. This could result in either one or two blocks.
  StringWriter w;
  w.write(reinterpret_cast<const char*>(data) + processed_offset, size - processed_offset);
  {
    w.put_u8(0x80);
    w.extend_to((w.size() > 0x38) ? 0x80 : 0x40, '\0');
    w.pput_u64l(w.size() - 8, size << 3);
  }
  for (size_t z = 0; z < w.size(); z += 0x40) {
    process_block(w.str().data() + z);
  }
}